

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,ElementsConfidentialAddress *confidential_address,
          ConfidentialAssetId *asset,Amount *amount)

{
  Script *in_stack_ffffffffffffff50;
  ConfidentialNonce *this_00;
  ConfidentialKey local_88;
  Script local_60;
  Amount *local_28;
  Amount *amount_local;
  ConfidentialAssetId *asset_local;
  ElementsConfidentialAddress *confidential_address_local;
  ConfidentialTxOut *this_local;
  
  local_28 = amount;
  amount_local = (Amount *)asset;
  asset_local = (ConfidentialAssetId *)confidential_address;
  confidential_address_local = (ElementsConfidentialAddress *)this;
  ElementsConfidentialAddress::GetLockingScript(&local_60,confidential_address);
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&local_60);
  Script::~Script(in_stack_ffffffffffffff50);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_009f73a0;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,(ConfidentialAssetId *)amount_local);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,local_28);
  this_00 = &this->nonce_;
  ElementsConfidentialAddress::GetConfidentialKey
            (&local_88,(ElementsConfidentialAddress *)asset_local);
  ConfidentialNonce::ConfidentialNonce(this_00,&local_88);
  Pubkey::~Pubkey((Pubkey *)0x4a614a);
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const ElementsConfidentialAddress &confidential_address,
    const ConfidentialAssetId &asset, const Amount &amount)
    : AbstractTxOut(confidential_address.GetLockingScript()),
      asset_(asset),
      confidential_value_(ConfidentialValue(amount)),
      nonce_(confidential_address.GetConfidentialKey()),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}